

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketProtocol.h
# Opt level: O2

bool uWS::WebSocketProtocol<true,_uWS::WebSocketContext<false,_true>_>::consumeContinuation
               (char **src,uint *length,WebSocketState<true> *wState,void *user)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  bool bVar5;
  uint uVar6;
  
  if (*length < wState->remainingBytes) {
    unmaskInplace(*src,*src + ((*length & 0xfffffffc) + 4),wState->mask);
    uVar3 = wState->remainingBytes - *length;
    wState->remainingBytes = uVar3;
    bVar2 = WebSocketContext<false,_true>::handleFragment
                      (*src,(ulong)*length,uVar3,
                       (uint)(wState->state).opCode[(char)(*(byte *)&wState->state * '\x02') >> 6],
                       (bool)(*(byte *)&wState->state >> 7),wState,user);
    if ((!bVar2) && ((*length & 3) != 0)) {
      rotateMask(4 - (*length & 3),wState->mask);
    }
    bVar5 = false;
  }
  else {
    uVar6 = wState->remainingBytes & 0xfffffffc;
    unmaskInplace(*src,*src + uVar6,wState->mask);
    uVar3 = wState->remainingBytes;
    for (uVar4 = 0; (uVar3 & 3) != uVar4; uVar4 = uVar4 + 1) {
      (*src)[uVar4 + (long)(int)uVar6] = (*src)[uVar4 + (long)(int)uVar6] ^ wState->mask[uVar4];
    }
    bVar5 = false;
    bVar2 = WebSocketContext<false,_true>::handleFragment
                      (*src,(ulong)wState->remainingBytes,0,
                       (uint)(wState->state).opCode[(char)(*(byte *)&wState->state * '\x02') >> 6],
                       (bool)(*(byte *)&wState->state >> 7),wState,user);
    if (!bVar2) {
      bVar1 = *(byte *)&wState->state;
      if ((char)bVar1 < '\0') {
        *(byte *)&wState->state = bVar1 & 0x9f | bVar1 + 0x60 & 0x60;
      }
      uVar3 = wState->remainingBytes;
      *src = *src + uVar3;
      *length = *length - uVar3;
      *(byte *)&wState->state = *(byte *)&wState->state | 1;
      bVar5 = true;
    }
  }
  return bVar5;
}

Assistant:

static inline bool consumeContinuation(char *&src, unsigned int &length, WebSocketState<isServer> *wState, void *user) {
        if (wState->remainingBytes <= length) {
            if (isServer) {
                int n = wState->remainingBytes >> 2;
                unmaskInplace(src, src + n * 4, wState->mask);
                for (int i = 0, s = wState->remainingBytes % 4; i < s; i++) {
                    src[n * 4 + i] ^= wState->mask[i];
                }
            }

            if (Impl::handleFragment(src, wState->remainingBytes, 0, wState->state.opCode[wState->state.opStack], wState->state.lastFin, wState, user)) {
                return false;
            }

            if (wState->state.lastFin) {
                wState->state.opStack--;
            }

            src += wState->remainingBytes;
            length -= wState->remainingBytes;
            wState->state.wantsHead = true;
            return true;
        } else {
            if (isServer) {
                unmaskInplace(src, src + ((length >> 2) + 1) * 4, wState->mask);
            }

            wState->remainingBytes -= length;
            if (Impl::handleFragment(src, length, wState->remainingBytes, wState->state.opCode[wState->state.opStack], wState->state.lastFin, wState, user)) {
                return false;
            }

            if (isServer && length % 4) {
                rotateMask(4 - (length % 4), wState->mask);
            }
            return false;
        }
    }